

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O0

void mk_mplayer_armor(monst *mon,short typ)

{
  int iVar1;
  obj *otmp;
  char local_28;
  char local_24;
  obj *obj;
  short typ_local;
  monst *mon_local;
  
  if (typ != 0) {
    otmp = mksobj(mon->dlevel,(int)typ,'\0','\0');
    iVar1 = rn2(3);
    if (iVar1 == 0) {
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffefff | 0x1000;
    }
    iVar1 = rn2(3);
    if (iVar1 == 0) {
      curse(otmp);
    }
    iVar1 = rn2(3);
    if (iVar1 == 0) {
      bless(otmp);
    }
    iVar1 = rn2(10);
    if (iVar1 == 0) {
      iVar1 = rnd(3);
      local_28 = -(char)iVar1;
    }
    else {
      iVar1 = rn2(3);
      if (iVar1 == 0) {
        iVar1 = rn2(4);
        local_24 = (char)iVar1 + '\x04';
      }
      else {
        iVar1 = rn2(5);
        local_24 = (char)iVar1;
      }
      local_28 = local_24;
    }
    otmp->spe = local_28;
    mpickobj(mon,otmp);
  }
  return;
}

Assistant:

static void mk_mplayer_armor(struct monst *mon, short typ)
{
	struct obj *obj;

	if (typ == STRANGE_OBJECT) return;
	obj = mksobj(mon->dlevel, typ, FALSE, FALSE);
	if (!rn2(3)) obj->oerodeproof = 1;
	if (!rn2(3)) curse(obj);
	if (!rn2(3)) bless(obj);
	/* Most players who get to the endgame who have cursed equipment
	 * have it because the wizard or other monsters cursed it, so its
	 * chances of having plusses is the same as usual....
	 */
	obj->spe = rn2(10) ? (rn2(3) ? rn2(5) : rn1(4,4)) : -rnd(3);
	mpickobj(mon, obj);
}